

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_read_int16_partial_array
              (coda_cursor *cursor,long offset,long length,int16_t *dst)

{
  coda_dynamic_type_struct *pcVar1;
  coda_mem_type *type;
  int16_t *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_binary) {
    cursor_local._4_4_ =
         read_partial_array(cursor,coda_cursor_read_int16,offset,length,(uint8_t *)dst,2);
  }
  else {
    if (pcVar1[1].backend != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x407,
                    "int coda_mem_cursor_read_int16_partial_array(const coda_cursor *, long, long, int16_t *)"
                   );
    }
    if (**(int **)(pcVar1->definition + 1) == 1) {
      cursor_local._4_4_ =
           read_partial_array(cursor,coda_bin_cursor_read_int16,offset,length,(uint8_t *)dst,2);
    }
    else {
      if (**(int **)(pcVar1->definition + 1) != 0) {
        __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                      ,0x40d,
                      "int coda_mem_cursor_read_int16_partial_array(const coda_cursor *, long, long, int16_t *)"
                     );
      }
      cursor_local._4_4_ =
           read_partial_array(cursor,coda_ascii_cursor_read_int16,offset,length,(uint8_t *)dst,2);
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_read_int16_partial_array(const coda_cursor *cursor, long offset, long length, int16_t *dst)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_partial_array(cursor, (read_function)&coda_cursor_read_int16, offset, length, (uint8_t *)dst,
                                  sizeof(int16_t));
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_int16, offset, length, (uint8_t *)dst,
                                  sizeof(int16_t));
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_int16, offset, length, (uint8_t *)dst,
                              sizeof(int16_t));
}